

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFboCompletenessTests.cpp
# Opt level: O1

string * __thiscall
deqp::gls::fboc::details::RenderableParams::getName_abi_cxx11_
          (string *__return_storage_ptr__,RenderableParams *this,RenderableParams *params)

{
  size_type *psVar1;
  ImageFormat IVar2;
  char *pcVar3;
  undefined8 *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string typeStr;
  string fmtStr;
  string s;
  ulong *local_d8;
  long local_d0;
  ulong local_c8 [2];
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long *local_38 [2];
  long local_28 [2];
  
  IVar2 = this->format;
  pcVar3 = glu::getTextureFormatName(IVar2.format);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_38,pcVar3,(allocator<char> *)&local_78);
  std::__cxx11::string::substr((ulong)&local_b8,(ulong)local_38);
  de::toLower(&local_78,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((ulong)IVar2 >> 0x20 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_78._M_dataplus._M_p,
               local_78._M_dataplus._M_p + local_78._M_string_length);
    goto LAB_01830192;
  }
  pcVar3 = glu::getTypeName(IVar2.unsizedType);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,pcVar3,(allocator<char> *)&local_d8);
  local_d8 = local_c8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d8,local_78._M_dataplus._M_p,
             local_78._M_dataplus._M_p + local_78._M_string_length);
  std::__cxx11::string::append((char *)&local_d8);
  std::__cxx11::string::substr((ulong)&local_58,(ulong)&local_b8);
  de::toLower(&local_98,&local_58);
  uVar5 = 0xf;
  if (local_d8 != local_c8) {
    uVar5 = local_c8[0];
  }
  if (uVar5 < local_98._M_string_length + local_d0) {
    uVar6 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      uVar6 = local_98.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar6 < local_98._M_string_length + local_d0) goto LAB_018300cb;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_d8);
  }
  else {
LAB_018300cb:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_98._M_dataplus._M_p);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar6 = puVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar6;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*puVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar1;
  }
  __return_storage_ptr__->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
LAB_01830192:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static string		getName				(const RenderableParams& params)
	{
		return formatName(params.format);
	}